

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

void parse_blend_design_positions(T1_Face face,T1_Loader loader)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  undefined8 uVar3;
  FT_UInt FVar4;
  FT_Error FVar5;
  FT_Fixed FVar6;
  long lVar7;
  PS_Blend pPVar8;
  long lVar9;
  T1_TokenRec *pTVar10;
  undefined1 local_238 [8];
  T1_TokenRec design_tokens [16];
  T1_TokenRec axis_tokens [4];
  FT_UInt local_3c;
  FT_UInt local_38;
  FT_Int num_designs;
  FT_Int n_axis;
  
  (*(loader->parser).root.funcs.to_token_array)
            ((PS_Parser)loader,(T1_Token)local_238,0x10,(FT_Int *)&local_3c);
  if ((int)local_3c < 0) {
    FVar5 = 0xa2;
  }
  else if (local_3c - 0x11 < 0xfffffff0) {
LAB_0022e0aa:
    FVar5 = 3;
  }
  else {
    pFVar1 = (loader->parser).root.cursor;
    pFVar2 = (loader->parser).root.limit;
    axis_tokens[3]._16_8_ = face;
    pPVar8 = face->blend;
    num_designs = 0;
    for (lVar7 = 0; lVar7 < (int)local_3c; lVar7 = lVar7 + 1) {
      (loader->parser).root.cursor = *(FT_Byte **)&design_tokens[lVar7 + -1].type;
      (loader->parser).root.limit = design_tokens[lVar7].start;
      (*(loader->parser).root.funcs.to_token_array)
                ((PS_Parser)loader,(T1_Token)&design_tokens[0xf].type,4,(FT_Int *)&local_38);
      FVar4 = local_38;
      uVar3 = axis_tokens[3]._16_8_;
      if (lVar7 == 0) {
        if (local_38 - 5 < 0xfffffffc) goto LAB_0022e0aa;
        FVar5 = t1_allocate_blend((T1_Face)axis_tokens[3]._16_8_,local_3c,local_38);
        if (FVar5 != 0) goto LAB_0022e1b3;
        pPVar8 = *(PS_Blend *)(uVar3 + 0x350);
        num_designs = FVar4;
      }
      else if (local_38 != num_designs) goto LAB_0022e0aa;
      pTVar10 = axis_tokens;
      for (lVar9 = 0; lVar9 < (int)local_38; lVar9 = lVar9 + 1) {
        (loader->parser).root.cursor = *(FT_Byte **)&pTVar10[-1].type;
        (loader->parser).root.limit = pTVar10->start;
        FVar6 = (*(loader->parser).root.funcs.to_fixed)((PS_Parser)loader,0);
        pPVar8->design_pos[lVar7][lVar9] = FVar6;
        pTVar10 = pTVar10 + 1;
      }
    }
    (loader->parser).root.cursor = pFVar1;
    (loader->parser).root.limit = pFVar2;
    FVar5 = 0;
  }
LAB_0022e1b3:
  (loader->parser).root.error = FVar5;
  return;
}

Assistant:

static void
  parse_blend_design_positions( T1_Face    face,
                                T1_Loader  loader )
  {
    T1_TokenRec  design_tokens[T1_MAX_MM_DESIGNS];
    FT_Int       num_designs;
    FT_Int       num_axis;
    T1_Parser    parser = &loader->parser;

    FT_Error     error = FT_Err_Ok;
    PS_Blend     blend;


    /* get the array of design tokens -- compute number of designs */
    T1_ToTokenArray( parser, design_tokens,
                     T1_MAX_MM_DESIGNS, &num_designs );
    if ( num_designs < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( num_designs == 0 || num_designs > T1_MAX_MM_DESIGNS )
    {
      FT_ERROR(( "parse_blend_design_positions:"
                 " incorrect number of designs: %d\n",
                 num_designs ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    {
      FT_Byte*  old_cursor = parser->root.cursor;
      FT_Byte*  old_limit  = parser->root.limit;
      FT_Int    n;


      blend    = face->blend;
      num_axis = 0;  /* make compiler happy */

      for ( n = 0; n < num_designs; n++ )
      {
        T1_TokenRec  axis_tokens[T1_MAX_MM_AXIS];
        T1_Token     token;
        FT_Int       axis, n_axis;


        /* read axis/coordinates tokens */
        token = design_tokens + n;
        parser->root.cursor = token->start;
        parser->root.limit  = token->limit;
        T1_ToTokenArray( parser, axis_tokens, T1_MAX_MM_AXIS, &n_axis );

        if ( n == 0 )
        {
          if ( n_axis <= 0 || n_axis > T1_MAX_MM_AXIS )
          {
            FT_ERROR(( "parse_blend_design_positions:"
                       " invalid number of axes: %d\n",
                       n_axis ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          num_axis = n_axis;
          error = t1_allocate_blend( face,
                                     (FT_UInt)num_designs,
                                     (FT_UInt)num_axis );
          if ( error )
            goto Exit;
          blend = face->blend;
        }
        else if ( n_axis != num_axis )
        {
          FT_ERROR(( "parse_blend_design_positions: incorrect table\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /* now read each axis token into the design position */
        for ( axis = 0; axis < n_axis; axis++ )
        {
          T1_Token  token2 = axis_tokens + axis;


          parser->root.cursor = token2->start;
          parser->root.limit  = token2->limit;
          blend->design_pos[n][axis] = T1_ToFixed( parser, 0 );
        }
      }

      loader->parser.root.cursor = old_cursor;
      loader->parser.root.limit  = old_limit;
    }

  Exit:
    loader->parser.root.error = error;
  }